

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O1

char * afm_parser_next_key(AFM_Parser parser,FT_Bool line,FT_Offset *len)

{
  AFM_Stream stream;
  char *pcVar1;
  FT_Byte *pFVar2;
  undefined7 in_register_00000031;
  
  stream = parser->stream;
  do {
    if (stream->status < 2) {
      afm_stream_read_string(stream);
    }
    stream->status = 0;
    pcVar1 = afm_stream_read_one(stream);
    if (pcVar1 != (char *)0x0) goto LAB_0014f396;
  } while (stream->status == 2);
  pcVar1 = (char *)0x0;
LAB_0014f396:
  if ((undefined8 *)CONCAT71(in_register_00000031,line) != (undefined8 *)0x0) {
    if (pcVar1 == (char *)0x0) {
      pFVar2 = (FT_Byte *)0x0;
    }
    else {
      pFVar2 = stream->cursor + ~(ulong)pcVar1;
    }
    *(undefined8 *)CONCAT71(in_register_00000031,line) = pFVar2;
  }
  return pcVar1;
}

Assistant:

FT_LOCAL_DEF( char* )
  afm_parser_next_key( AFM_Parser  parser,
                       FT_Bool     line,
                       FT_Offset*  len )
  {
    AFM_Stream  stream = parser->stream;
    char*       key    = NULL;  /* make stupid compiler happy */


    if ( line )
    {
      while ( 1 )
      {
        /* skip current line */
        if ( !AFM_STATUS_EOL( stream ) )
          afm_stream_read_string( stream );

        stream->status = AFM_STREAM_STATUS_NORMAL;
        key = afm_stream_read_one( stream );

        /* skip empty line */
        if ( !key                      &&
             !AFM_STATUS_EOF( stream ) &&
             AFM_STATUS_EOL( stream )  )
          continue;

        break;
      }
    }
    else
    {
      while ( 1 )
      {
        /* skip current column */
        while ( !AFM_STATUS_EOC( stream ) )
          afm_stream_read_one( stream );

        stream->status = AFM_STREAM_STATUS_NORMAL;
        key = afm_stream_read_one( stream );

        /* skip empty column */
        if ( !key                      &&
             !AFM_STATUS_EOF( stream ) &&
             AFM_STATUS_EOC( stream )  )
          continue;

        break;
      }
    }

    if ( len )
      *len = ( key ) ? (FT_Offset)AFM_STREAM_KEY_LEN( stream, key )
                     : 0;

    return key;
  }